

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O3

bool __thiscall ON_OBSOLETE_V5_HatchExtra::CopyFrom(ON_OBSOLETE_V5_HatchExtra *this,ON_Object *src)

{
  _func_int **pp_Var1;
  bool bVar2;
  
  if (src == (ON_Object *)0x0) {
    return false;
  }
  bVar2 = ON_Object::IsKindOf(src,&m_ON_OBSOLETE_V5_HatchExtra_class_rtti);
  if (bVar2) {
    ON_UserData::operator=(&this->super_ON_UserData,(ON_UserData *)src);
    pp_Var1 = src[0xd]._vptr_ON_Object;
    (this->m_basepoint).x = (double)src[0xc].m_userdata_list;
    (this->m_basepoint).y = (double)pp_Var1;
  }
  return bVar2;
}

Assistant:

ON_OBSOLETE_V5_HatchExtra* ON_OBSOLETE_V5_HatchExtra::HatchExtension(const ON_Hatch* pHatch)
{
  ON_OBSOLETE_V5_HatchExtra* pExtra = nullptr;
  if(pHatch)
  {
    pExtra = ON_OBSOLETE_V5_HatchExtra::Cast(pHatch->GetUserData(ON_CLASS_ID(ON_OBSOLETE_V5_HatchExtra)));
    if(pExtra == nullptr)
    {
      pExtra = new ON_OBSOLETE_V5_HatchExtra;
      if(pExtra)
      {
        if(!const_cast<ON_Hatch*>(pHatch)->AttachUserData(pExtra))
        {
          delete pExtra;
          pExtra = nullptr;
        }
      }  
    }
  }
  return pExtra;
}